

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<Parser::IncludePath>::copyAppend
          (QGenericArrayOps<Parser::IncludePath> *this,IncludePath *b,IncludePath *e)

{
  IncludePath *pIVar1;
  Data *pDVar2;
  long lVar3;
  long lVar4;
  
  if ((b != e) && (b < e)) {
    pIVar1 = (this->super_QArrayDataPointer<Parser::IncludePath>).ptr;
    lVar4 = (this->super_QArrayDataPointer<Parser::IncludePath>).size;
    do {
      pDVar2 = (b->path).d.d;
      pIVar1[lVar4].path.d.d = pDVar2;
      pIVar1[lVar4].path.d.ptr = (b->path).d.ptr;
      pIVar1[lVar4].path.d.size = (b->path).d.size;
      lVar3 = lVar4;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
        lVar3 = (this->super_QArrayDataPointer<Parser::IncludePath>).size;
      }
      pIVar1[lVar4].isFrameworkPath = b->isFrameworkPath;
      b = b + 1;
      lVar4 = lVar3 + 1;
      (this->super_QArrayDataPointer<Parser::IncludePath>).size = lVar4;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }